

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall el::base::LogFormat::LogFormat(LogFormat *this,Level level,string_t *format)

{
  string_t *format_local;
  Level level_local;
  LogFormat *this_local;
  
  Loggable::Loggable(&this->super_Loggable);
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__LogFormat_0028fdb0;
  this->m_level = level;
  std::__cxx11::string::string((string *)&this->m_userFormat,(string *)format);
  std::__cxx11::string::string((string *)&this->m_format);
  std::__cxx11::string::string((string *)&this->m_dateTimeFormat);
  utils::OS::currentUser_abi_cxx11_();
  utils::OS::currentHost_abi_cxx11_();
  parseFromFormat(this,&this->m_userFormat);
  return;
}

Assistant:

LogFormat::LogFormat(Level level, const base::type::string_t& format)
  : m_level(level), m_userFormat(format), m_currentUser(base::utils::OS::currentUser()),
    m_currentHost(base::utils::OS::currentHost()) {
  parseFromFormat(m_userFormat);
}